

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::setProperty(Federate *this,int32_t option,double timeValue)

{
  uint uVar1;
  element_type *peVar2;
  _func_int *UNRECOVERED_JUMPTABLE;
  baseType bVar3;
  
  if (option == 0x98) {
    bVar3 = count_time<9,_long>::convert(timeValue);
    (this->mStopTime).internalTimeCode = bVar3;
    return;
  }
  peVar2 = (this->coreObject).super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar1 = (this->fedID).fid;
  bVar3 = count_time<9,_long>::convert(timeValue);
  UNRECOVERED_JUMPTABLE = peVar2->_vptr_Core[0x1d];
  (*UNRECOVERED_JUMPTABLE)(peVar2,(ulong)uVar1,(ulong)(uint)option,bVar3,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void Federate::setProperty(int32_t option, double timeValue)
{
    if (option == defs::Properties::STOPTIME) {
        mStopTime = timeValue;
        return;
    }
    coreObject->setTimeProperty(fedID, option, timeValue);
}